

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall Liby::Connection::sync_send(Connection *this,Buffer *buffer)

{
  element_type *peVar1;
  bool bVar2;
  char *__buf;
  size_t __n;
  ssize_t sVar3;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  Socket::setNoblock((this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,false);
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:115:23)>
             ::_M_invoke;
  local_40._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp:115:23)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  while( true ) {
    bVar2 = Buffer::empty(buffer);
    if (bVar2) break;
    peVar1 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    __buf = Buffer::data(buffer);
    __n = Buffer::size(buffer);
    sVar3 = write(peVar1->fd_,__buf,__n);
    if ((int)(uint)sVar3 < 1) break;
    Buffer::retrieve(buffer,(ulong)((uint)sVar3 & 0x7fffffff));
  }
  DeferCaller::~DeferCaller((DeferCaller *)&local_40);
  return;
}

Assistant:

void Connection::sync_send(Buffer &buffer) {
    socket_->setNoblock(false);
    DeferCaller defer([this] { socket_->setNoblock(); });
    while (!buffer.empty()) {
        int nbytes =
            socket_->write(static_cast<void *>(buffer.data()), buffer.size());
        if (nbytes > 0) {
            buffer.retrieve(nbytes);
        } else {
            break;
        }
    }
}